

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathBezierCubicCurveTo
          (ImDrawList *this,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,int num_segments)

{
  undefined8 uVar1;
  ImVec2 *pIVar2;
  ImVector<ImVec2> *this_00;
  long in_RDI;
  int in_R8D;
  float fVar3;
  undefined1 auVar4 [64];
  int in_stack_0000000c;
  float in_stack_00000010;
  float in_stack_00000014;
  float in_stack_00000018;
  float in_stack_0000001c;
  float in_stack_00000020;
  int i_step;
  float t_step;
  ImVec2 p1;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  ImVector<ImVec2> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar5;
  float fVar6;
  float fVar7;
  undefined1 extraout_var [56];
  
  pIVar2 = ImVector<ImVec2>::back(in_stack_ffffffffffffffb0);
  fVar6 = (*pIVar2).x;
  fVar7 = (*pIVar2).y;
  if (in_R8D == 0) {
    PathBezierCubicCurveToCasteljau
              ((ImVector<ImVec2> *)CONCAT44(num_segments,p1.y),p1.x,t_step,(float)i_step,
               in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000014,
               in_stack_00000010,p3._0_4_,in_stack_0000000c);
  }
  else {
    fVar3 = 1.0 / (float)in_R8D;
    for (iVar5 = 1; iVar5 <= in_R8D; iVar5 = iVar5 + 1) {
      this_00 = (ImVector<ImVec2> *)(in_RDI + 0x78);
      auVar4._0_8_ = ImBezierCubicCalc((ImVec2 *)CONCAT44(in_R8D,fVar7),
                                       (ImVec2 *)CONCAT44(fVar6,fVar3),
                                       (ImVec2 *)CONCAT44(iVar5,in_stack_ffffffffffffffc8),
                                       (ImVec2 *)
                                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                                       ,(float)((ulong)in_RDI >> 0x20));
      auVar4._8_56_ = extraout_var;
      uVar1 = vmovlpd_avx(auVar4._0_16_);
      in_stack_ffffffffffffffc4 = (undefined4)uVar1;
      in_stack_ffffffffffffffc8 = (undefined4)((ulong)uVar1 >> 0x20);
      ImVector<ImVec2>::push_back
                (this_00,(ImVec2 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
  }
  return;
}

Assistant:

void ImDrawList::PathBezierCubicCurveTo(const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        PathBezierCubicCurveToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, p4.x, p4.y, _Data->CurveTessellationTol, 0); // Auto-tessellated
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
            _Path.push_back(ImBezierCubicCalc(p1, p2, p3, p4, t_step * i_step));
    }
}